

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claqgs.c
# Opt level: O3

void claqgs(SuperMatrix *A,float *r,float *c,float rowcnd,float colcnd,float amax,char *equed)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  char cVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  cVar9 = 'N';
  if ((0 < A->nrow) && (0 < A->ncol)) {
    pvVar4 = A->Store;
    lVar5 = *(long *)((long)pvVar4 + 8);
    fVar13 = smach("Safe minimum");
    fVar14 = smach("Precision");
    if ((rowcnd < 0.1) || ((amax < fVar13 / fVar14 || (1.0 / (fVar13 / fVar14) < amax)))) {
      uVar3 = A->ncol;
      if (0.1 <= colcnd) {
        cVar9 = 'R';
        if (0 < (int)uVar3) {
          piVar6 = *(int **)((long)pvVar4 + 0x18);
          uVar11 = 0;
          iVar8 = *piVar6;
          do {
            iVar7 = piVar6[uVar11 + 1];
            if (iVar8 < iVar7) {
              lVar10 = *(long *)((long)pvVar4 + 0x10);
              lVar12 = (long)iVar8;
              do {
                iVar8 = *(int *)(lVar10 + lVar12 * 4);
                *(float *)(lVar5 + lVar12 * 8) = *(float *)(lVar5 + lVar12 * 8) * r[iVar8];
                *(float *)(lVar5 + 4 + lVar12 * 8) = *(float *)(lVar5 + 4 + lVar12 * 8) * r[iVar8];
                lVar12 = lVar12 + 1;
              } while (iVar7 != lVar12);
            }
            uVar11 = uVar11 + 1;
            iVar8 = iVar7;
          } while (uVar11 != uVar3);
        }
      }
      else {
        cVar9 = 'B';
        if (0 < (int)uVar3) {
          piVar6 = *(int **)((long)pvVar4 + 0x18);
          uVar11 = 0;
          iVar8 = *piVar6;
          do {
            iVar7 = piVar6[uVar11 + 1];
            if (iVar8 < iVar7) {
              fVar13 = c[uVar11];
              lVar10 = *(long *)((long)pvVar4 + 0x10);
              lVar12 = (long)iVar8;
              do {
                uVar1 = *(undefined8 *)(lVar5 + lVar12 * 8);
                *(ulong *)(lVar5 + lVar12 * 8) =
                     CONCAT44(r[*(int *)(lVar10 + lVar12 * 4)] * fVar13 *
                              (float)((ulong)uVar1 >> 0x20),
                              r[*(int *)(lVar10 + lVar12 * 4)] * fVar13 * (float)uVar1);
                lVar12 = lVar12 + 1;
              } while (iVar7 != lVar12);
            }
            uVar11 = uVar11 + 1;
            iVar8 = iVar7;
          } while (uVar11 != uVar3);
        }
      }
    }
    else if (colcnd < 0.1) {
      iVar8 = A->ncol;
      cVar9 = 'C';
      if (0 < (long)iVar8) {
        piVar6 = *(int **)((long)pvVar4 + 0x18);
        lVar10 = 0;
        iVar7 = *piVar6;
        do {
          iVar2 = piVar6[lVar10 + 1];
          if (iVar7 < iVar2) {
            lVar12 = (long)iVar7;
            fVar13 = c[lVar10];
            do {
              uVar1 = *(undefined8 *)(lVar5 + lVar12 * 8);
              *(ulong *)(lVar5 + lVar12 * 8) =
                   CONCAT44((float)((ulong)uVar1 >> 0x20) * fVar13,(float)uVar1 * fVar13);
              lVar12 = lVar12 + 1;
            } while (iVar2 != lVar12);
          }
          lVar10 = lVar10 + 1;
          iVar7 = iVar2;
        } while (lVar10 != iVar8);
      }
    }
  }
  *equed = cVar9;
  return;
}

Assistant:

void
claqgs(SuperMatrix *A, float *r, float *c, 
	float rowcnd, float colcnd, float amax, char *equed)
{


#define THRESH    (0.1)
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int_t i, j;
    int   irow;
    float large, small, cj;
    float temp;


    /* Quick return if possible */
    if (A->nrow <= 0 || A->ncol <= 0) {
	*(unsigned char *)equed = 'N';
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Initialize LARGE and SMALL. */
    small = smach("Safe minimum") / smach("Precision");
    large = 1. / small;

    if (rowcnd >= THRESH && amax >= small && amax <= large) {
	if (colcnd >= THRESH)
	    *(unsigned char *)equed = 'N';
	else {
	    /* Column scaling */
	    for (j = 0; j < A->ncol; ++j) {
		cj = c[j];
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    cs_mult(&Aval[i], &Aval[i], cj);
                }
	    }
	    *(unsigned char *)equed = 'C';
	}
    } else if (colcnd >= THRESH) {
	/* Row scaling, no column scaling */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		cs_mult(&Aval[i], &Aval[i], r[irow]);
	    }
	*(unsigned char *)equed = 'R';
    } else {
	/* Row and column scaling */
	for (j = 0; j < A->ncol; ++j) {
	    cj = c[j];
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		temp = cj * r[irow];
		cs_mult(&Aval[i], &Aval[i], temp);
	    }
	}
	*(unsigned char *)equed = 'B';
    }

    return;

}